

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::MapReflectionTester::RemoveLastMapsViaReflection
          (MapReflectionTester *this,Message *message)

{
  FieldDescriptor *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppFVar3;
  FieldDescriptor *field;
  int i;
  undefined1 local_38 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  output;
  Reflection *reflection;
  Message *message_local;
  MapReflectionTester *this_local;
  
  output.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Message::GetReflection(message);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_38);
  Reflection::ListFields
            ((Reflection *)
             output.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_38);
  for (field._0_4_ = 0;
      sVar2 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_38), (ulong)(long)(int)field < sVar2; field._0_4_ = (int)field + 1) {
    ppFVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)local_38,(long)(int)field);
    this_00 = *ppFVar3;
    bVar1 = FieldDescriptor::is_repeated(this_00);
    if (bVar1) {
      Reflection::RemoveLast
                ((Reflection *)
                 output.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this_00);
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_38);
  return;
}

Assistant:

void MapReflectionTester::RemoveLastMapsViaReflection(Message* message) {
  const Reflection* reflection = message->GetReflection();

  std::vector<const FieldDescriptor*> output;
  reflection->ListFields(*message, &output);
  for (int i = 0; i < output.size(); ++i) {
    const FieldDescriptor* field = output[i];
    if (!field->is_repeated()) continue;
    reflection->RemoveLast(message, field);
  }
}